

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * createTableStmt(sqlite3 *db,Table *p)

{
  short sVar1;
  uint uVar2;
  char *zBuf;
  size_t sVar3;
  Column *pCVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  uint local_58;
  int local_54;
  char *local_50;
  char *local_48;
  Table *local_40;
  char *local_38;
  
  sVar1 = p->nCol;
  if (0 < sVar1) {
    pCVar4 = p->aCol;
    iVar5 = 0;
    iVar7 = 0;
LAB_001996fc:
    pcVar8 = pCVar4->zName;
    iVar6 = 0;
    do {
      if (*pcVar8 == '\"') {
        iVar6 = iVar6 + 1;
      }
      else if (*pcVar8 == '\0') goto LAB_0019971b;
      iVar6 = iVar6 + 1;
      pcVar8 = pcVar8 + 1;
    } while( true );
  }
  iVar6 = 2;
LAB_00199738:
  pcVar8 = p->zName;
  iVar5 = 0;
  do {
    if (*pcVar8 == '\"') {
      iVar5 = iVar5 + 1;
    }
    else if (*pcVar8 == '\0') {
      iVar6 = iVar6 + iVar5;
      local_38 = ",\n  ";
      if (iVar6 < 0x32) {
        local_38 = ",";
      }
      pcVar8 = "\n)";
      if (iVar6 < 0x32) {
        pcVar8 = ")";
      }
      iVar5 = iVar6 + 0x23 + sVar1 * 6;
      zBuf = (char *)sqlite3Malloc((long)iVar5);
      if (zBuf == (char *)0x0) {
        sqlite3OomFault(db);
      }
      else {
        local_48 = pcVar8;
        sqlite3_snprintf(iVar5,zBuf,"CREATE TABLE ");
        sVar3 = strlen(zBuf);
        local_58 = (uint)sVar3 & 0x3fffffff;
        identPut(zBuf,(int *)&local_58,p->zName);
        uVar2 = local_58 + 1;
        zBuf[(int)local_58] = '(';
        local_50 = zBuf;
        if (0 < p->nCol) {
          pCVar4 = p->aCol;
          pcVar8 = "\n  ";
          if (iVar6 < 0x32) {
            pcVar8 = "";
          }
          iVar6 = 0;
          local_54 = iVar5;
          local_40 = p;
          do {
            sqlite3_snprintf(local_54 - uVar2,zBuf + (int)uVar2,pcVar8);
            sVar3 = strlen(zBuf + (int)uVar2);
            local_58 = uVar2 + ((uint)sVar3 & 0x3fffffff);
            identPut(zBuf,(int *)&local_58,pCVar4->zName);
            pcVar8 = pragCName[(long)pCVar4->affinity + 0xb];
            sVar3 = strlen(pcVar8);
            uVar2 = local_58;
            memcpy(zBuf + (int)local_58,pcVar8,(ulong)((uint)sVar3 & 0x3fffffff));
            uVar2 = uVar2 + ((uint)sVar3 & 0x3fffffff);
            iVar6 = iVar6 + 1;
            pCVar4 = pCVar4 + 1;
            pcVar8 = local_38;
            iVar5 = local_54;
            local_58 = uVar2;
          } while (iVar6 < local_40->nCol);
        }
        zBuf = local_50;
        sqlite3_snprintf(iVar5 - uVar2,local_50 + (int)uVar2,"%s",local_48);
      }
      return zBuf;
    }
    iVar5 = iVar5 + 1;
    pcVar8 = pcVar8 + 1;
  } while( true );
LAB_0019971b:
  iVar6 = iVar7 + iVar6;
  iVar7 = iVar6 + 7;
  iVar5 = iVar5 + 1;
  pCVar4 = pCVar4 + 1;
  if (iVar5 == sVar1) goto code_r0x0019972c;
  goto LAB_001996fc;
code_r0x0019972c:
  iVar6 = iVar6 + 9;
  goto LAB_00199738;
}

Assistant:

static char *createTableStmt(sqlite3 *db, Table *p){
  int i, k, n;
  char *zStmt;
  char *zSep, *zSep2, *zEnd;
  Column *pCol;
  n = 0;
  for(pCol = p->aCol, i=0; i<p->nCol; i++, pCol++){
    n += identLength(pCol->zName) + 5;
  }
  n += identLength(p->zName);
  if( n<50 ){ 
    zSep = "";
    zSep2 = ",";
    zEnd = ")";
  }else{
    zSep = "\n  ";
    zSep2 = ",\n  ";
    zEnd = "\n)";
  }
  n += 35 + 6*p->nCol;
  zStmt = sqlite3DbMallocRaw(0, n);
  if( zStmt==0 ){
    sqlite3OomFault(db);
    return 0;
  }
  sqlite3_snprintf(n, zStmt, "CREATE TABLE ");
  k = sqlite3Strlen30(zStmt);
  identPut(zStmt, &k, p->zName);
  zStmt[k++] = '(';
  for(pCol=p->aCol, i=0; i<p->nCol; i++, pCol++){
    static const char * const azType[] = {
        /* SQLITE_AFF_BLOB    */ "",
        /* SQLITE_AFF_TEXT    */ " TEXT",
        /* SQLITE_AFF_NUMERIC */ " NUM",
        /* SQLITE_AFF_INTEGER */ " INT",
        /* SQLITE_AFF_REAL    */ " REAL"
    };
    int len;
    const char *zType;

    sqlite3_snprintf(n-k, &zStmt[k], zSep);
    k += sqlite3Strlen30(&zStmt[k]);
    zSep = zSep2;
    identPut(zStmt, &k, pCol->zName);
    assert( pCol->affinity-SQLITE_AFF_BLOB >= 0 );
    assert( pCol->affinity-SQLITE_AFF_BLOB < ArraySize(azType) );
    testcase( pCol->affinity==SQLITE_AFF_BLOB );
    testcase( pCol->affinity==SQLITE_AFF_TEXT );
    testcase( pCol->affinity==SQLITE_AFF_NUMERIC );
    testcase( pCol->affinity==SQLITE_AFF_INTEGER );
    testcase( pCol->affinity==SQLITE_AFF_REAL );
    
    zType = azType[pCol->affinity - SQLITE_AFF_BLOB];
    len = sqlite3Strlen30(zType);
    assert( pCol->affinity==SQLITE_AFF_BLOB 
            || pCol->affinity==sqlite3AffinityType(zType, 0) );
    memcpy(&zStmt[k], zType, len);
    k += len;
    assert( k<=n );
  }
  sqlite3_snprintf(n-k, &zStmt[k], "%s", zEnd);
  return zStmt;
}